

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.hpp
# Opt level: O0

type jsoncons::detail::to_integer<int,wchar_t>(wchar_t *s,size_t length,int *n)

{
  wchar_t wVar1;
  int iVar2;
  uint uVar3;
  wchar_t *ptr_;
  uint *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar4;
  long in_RSI;
  wchar_t *in_RDI;
  type tVar5;
  type tVar6;
  wchar_t *unaff_retaddr;
  type ru;
  U u;
  bool is_negative;
  uint local_30;
  wchar_t *in_stack_fffffffffffffff0;
  to_integer_errc in_stack_fffffffffffffff8;
  undefined7 in_stack_fffffffffffffff9;
  
  *in_RDX = 0;
  if (in_RSI == 0) {
    to_integer_result<int,_wchar_t>::to_integer_result
              ((to_integer_result<int,_wchar_t> *)&stack0xfffffffffffffff0,in_RDI,invalid_number);
    uVar4 = extraout_RDX;
  }
  else {
    wVar1 = *in_RDI;
    tVar5 = to_integer<unsigned_int,wchar_t>
                      (unaff_retaddr,CONCAT71(in_stack_fffffffffffffff9,in_stack_fffffffffffffff8),
                       (uint *)in_stack_fffffffffffffff0);
    ptr_ = tVar5.ptr;
    if (tVar5.ec == success) {
      if (wVar1 == L'-') {
        iVar2 = ext_traits::integer_limits<int,_void>::lowest();
        if (1U - (iVar2 + 1) < local_30) {
          to_integer_result<int,_wchar_t>::to_integer_result
                    ((to_integer_result<int,_wchar_t> *)&stack0xfffffffffffffff0,ptr_,overflow);
          uVar4 = extraout_RDX_01;
        }
        else {
          *in_RDX = -local_30;
          to_integer_result<int,_wchar_t>::to_integer_result
                    ((to_integer_result<int,_wchar_t> *)&stack0xfffffffffffffff0,ptr_,success);
          uVar4 = extraout_RDX_02;
        }
      }
      else {
        uVar3 = ext_traits::integer_limits<int,_void>::max();
        if (uVar3 < local_30) {
          to_integer_result<int,_wchar_t>::to_integer_result
                    ((to_integer_result<int,_wchar_t> *)&stack0xfffffffffffffff0,ptr_,overflow);
          uVar4 = extraout_RDX_03;
        }
        else {
          *in_RDX = local_30;
          to_integer_result<int,_wchar_t>::to_integer_result
                    ((to_integer_result<int,_wchar_t> *)&stack0xfffffffffffffff0,ptr_,success);
          uVar4 = extraout_RDX_04;
        }
      }
    }
    else {
      to_integer_result<int,_wchar_t>::to_integer_result
                ((to_integer_result<int,_wchar_t> *)&stack0xfffffffffffffff0,ptr_,tVar5.ec);
      uVar4 = extraout_RDX_00;
    }
  }
  tVar6._9_7_ = (undefined7)((ulong)uVar4 >> 8);
  tVar6.ec = in_stack_fffffffffffffff8;
  tVar6.ptr = in_stack_fffffffffffffff0;
  return tVar6;
}

Assistant:

typename std::enable_if<ext_traits::integer_limits<T>::is_specialized && ext_traits::integer_limits<T>::is_signed,to_integer_result<T,CharT>>::type
to_integer(const CharT* s, std::size_t length, T& n)
{
    n = 0;

    if (length == 0)
    {
        return to_integer_result<T,CharT>(s, to_integer_errc::invalid_number);
    }

    bool is_negative = *s == '-' ? true : false;
    if (is_negative)
    {
        ++s;
        --length;
    }

    using U = typename ext_traits::make_unsigned<T>::type;

    U u;
    auto ru = to_integer(s, length, u);
    if (ru.ec != to_integer_errc())
    {
        return to_integer_result<T,CharT>(ru.ptr, ru.ec);
    }
    if (is_negative)
    {
        if (u > static_cast<U>(-((ext_traits::integer_limits<T>::lowest)()+T(1))) + U(1))
        {
            return to_integer_result<T,CharT>(ru.ptr, to_integer_errc::overflow);
        }
        else
        {
            n = static_cast<T>(U(0) - u);
            return to_integer_result<T,CharT>(ru.ptr, to_integer_errc());
        }
    }
    else
    {
        if (u > static_cast<U>((ext_traits::integer_limits<T>::max)()))
        {
            return to_integer_result<T,CharT>(ru.ptr, to_integer_errc::overflow);
        }
        else
        {
            n = static_cast<T>(u);
            return to_integer_result<T,CharT>(ru.ptr, to_integer_errc());
        }
    }
}